

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPrecisionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ShaderUintPrecisionCase::~ShaderUintPrecisionCase
          (ShaderUintPrecisionCase *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderUintPrecisionCase_00c0dac0;
  deinit(this);
  std::__cxx11::string::~string((string *)&this->m_op);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

ShaderUintPrecisionCase::~ShaderUintPrecisionCase (void)
{
	ShaderUintPrecisionCase::deinit();
}